

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunCommonSubexpressionElimination(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValueType VVar1;
  VmValue *pVVar2;
  VmConstant *pVVar3;
  VmConstant *pVVar4;
  bool bVar5;
  byte bVar6;
  VmValue *pVVar7;
  uint uVar8;
  VmConstant *rhs;
  VmConstant *this;
  VmValue *replacement;
  ulong uVar9;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 3) {
      pVVar7 = (VmValue *)value[1].comment.end;
      if (pVVar7 != (VmValue *)0x0) {
        do {
          pVVar2 = pVVar7[1].users.little[0];
          if (((pVVar7->hasSideEffects == false) && (pVVar7->hasMemoryAccess == false)) &&
             (replacement = *(VmValue **)&pVVar7[1].users.count, replacement != (VmValue *)0x0)) {
            uVar8 = 0;
            while ((*(int *)&replacement[1]._vptr_VmValue != *(int *)&pVVar7[1]._vptr_VmValue ||
                   (VVar1 = replacement[1].type.type, VVar1 != pVVar7[1].type.type))) {
LAB_001b2bca:
              replacement = *(VmValue **)&replacement[1].users.count;
              if ((replacement == (VmValue *)0x0) ||
                 (bVar5 = 0x3e < uVar8, uVar8 = uVar8 + 1, bVar5)) goto LAB_001b2bfb;
            }
            if ((ulong)VVar1 != 0) {
              bVar6 = 1;
              uVar9 = 0;
              do {
                pVVar3 = *(VmConstant **)(*(long *)&pVVar7[1].typeID + uVar9 * 8);
                this = pVVar3;
                if ((pVVar3->super_VmValue).typeID != 1) {
                  this = (VmConstant *)0x0;
                }
                pVVar4 = *(VmConstant **)(*(long *)&replacement[1].typeID + uVar9 * 8);
                rhs = pVVar4;
                if ((pVVar4->super_VmValue).typeID != 1) {
                  rhs = (VmConstant *)0x0;
                }
                if ((this == (VmConstant *)0x0) || (rhs == (VmConstant *)0x0)) {
                  bVar5 = pVVar3 == pVVar4;
                }
                else {
                  bVar5 = VmConstant::operator==(this,rhs);
                }
                bVar6 = bVar6 & bVar5;
                uVar9 = uVar9 + 1;
              } while (VVar1 != uVar9);
              if (bVar6 == 0) goto LAB_001b2bca;
            }
            anon_unknown.dwarf_12e14a::ReplaceValueUsersWith
                      (module,pVVar7,replacement,&module->commonSubexprEliminations);
          }
LAB_001b2bfb:
          pVVar7 = pVVar2;
        } while (pVVar2 != (VmValue *)0x0);
      }
    }
    else if (value->typeID == 4) {
      pVVar7 = (VmValue *)value[1].source;
      while (pVVar7 != (VmValue *)0x0) {
        pVVar2 = (VmValue *)pVVar7[1].comment.begin;
        RunCommonSubexpressionElimination(ctx,module,pVVar7);
        pVVar7 = pVVar2;
      }
    }
  }
  return;
}

Assistant:

void RunCommonSubexpressionElimination(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunCommonSubexpressionElimination(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->hasSideEffects || curr->hasMemoryAccess)
			{
				curr = next;
				continue;
			}

			VmInstruction *prev = curr->prevSibling;

			unsigned distance = 0;

			while(prev && distance < 64)
			{
				if(prev->cmd == curr->cmd && prev->arguments.count == curr->arguments.count)
				{
					bool same = true;

					for(unsigned i = 0, e = curr->arguments.count; i < e; i++)
					{
						VmValue *currArg = curr->arguments.data[i];
						VmValue *prevArg = prev->arguments.data[i];

						VmConstant *currArgAsConst = currArg->typeID == VmConstant::myTypeID ? static_cast<VmConstant*>(currArg) : NULL;
						VmConstant *prevArgAsConst = prevArg->typeID == VmConstant::myTypeID ? static_cast<VmConstant*>(prevArg) : NULL;

						if(currArgAsConst && prevArgAsConst)
						{
							if(!(*currArgAsConst == *prevArgAsConst))
								same = false;
						}
						else if(currArg != prevArg)
						{
							same = false;
						}
					}

					if(same)
					{
						ReplaceValueUsersWith(module, curr, prev, &module->commonSubexprEliminations);
						break;
					}
				}

				prev = prev->prevSibling;
				distance++;
			}

			curr = next;
		}
	}
}